

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::anon_unknown_36::HttpClientImpl::watchForClose(HttpClientImpl *this)

{
  SourceLocation location;
  SourceLocation local_58;
  HttpClientImpl *local_30;
  HttpClientImpl *local_10;
  HttpClientImpl *this_local;
  
  local_10 = this;
  HttpInputStreamImpl::awaitNextMessage((HttpInputStreamImpl *)&stack0xffffffffffffffd8);
  local_30 = this;
  Promise<bool>::then<kj::(anonymous_namespace)::HttpClientImpl::watchForClose()::_lambda(bool)_1_>
            ((Promise<bool> *)&stack0xffffffffffffffe0,(Type *)&stack0xffffffffffffffd8);
  SourceLocation::SourceLocation
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"watchForClose",0x1648,0x18);
  location.function = local_58.function;
  location.fileName = local_58.fileName;
  location.lineNumber = local_58.lineNumber;
  location.columnNumber = local_58.columnNumber;
  Promise<void>::eagerlyEvaluate
            ((Promise<void> *)&stack0xffffffffffffffe8,&stack0xffffffffffffffe0,location);
  Maybe<kj::Promise<void>_>::operator=
            (&this->closeWatcherTask,(Promise<void> *)&stack0xffffffffffffffe8);
  Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffe8);
  Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffe0);
  Promise<bool>::~Promise((Promise<bool> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void watchForClose() {
    closeWatcherTask = httpInput.awaitNextMessage()
        .then([this](bool hasData) -> kj::Promise<void> {
      if (hasData) {
        // Uhh... The server sent some data before we asked for anything. Perhaps due to properties
        // of this application, the server somehow already knows what the next request will be, and
        // it is trying to optimize. Or maybe this is some sort of test and the server is just
        // replaying a script. In any case, we will humor it -- leave the data in the buffer and
        // let it become the response to the next request.
        return kj::READY_NOW;
      } else {
        // EOF -- server disconnected.
        closed = true;
        if (httpOutput.isInBody()) {
          // Huh, the application is still sending a request. We should let it finish. We do not
          // need to proactively free the socket in this case because we know that we're not
          // sitting in a reusable connection pool, because we know the application is still
          // actively using the connection.
          return kj::READY_NOW;
        } else {
          return httpOutput.flush().then([this]() {
            // We might be sitting in NetworkAddressHttpClient's `availableClients` pool. We don't
            // have a way to notify it to remove this client from the pool; instead, when it tries
            // to pull this client from the pool later, it will notice the client is dead and will
            // discard it then. But, we would like to avoid holding on to a socket forever. So,
            // destroy the socket now.
            // TODO(cleanup): Maybe we should arrange to proactively remove ourselves? Seems
            //   like the code will be awkward.
            ownStream = nullptr;
          });
        }
      }
    }).eagerlyEvaluate(nullptr);
  }